

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_new_promise_capability(JSContext *ctx,JSValue *resolving_funcs,JSValue ctor)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  JSValue obj;
  JSValue v;
  JSValue JVar8;
  JSValueUnion local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  
  local_58.ptr = (void *)(local_58 << 0x20);
  local_50 = 3;
  local_48 = 0;
  local_40 = 3;
  iVar3 = 0;
  v = JS_NewCFunctionData(ctx,js_promise_executor,2,0,2,(JSValue *)&local_58);
  if ((int)v.tag == 6) {
    uVar5 = (ulong)v.u.ptr & 0xffffffff00000000;
  }
  else {
    _local_58 = v;
    if ((int)ctor.tag == 3) {
      v = js_promise_constructor(ctx,ctor,iVar3,(JSValue *)&local_58);
    }
    else {
      v = JS_CallConstructorInternal(ctx,ctor,ctor,1,(JSValue *)&local_58,2);
    }
    JVar4 = v.u;
    if ((uint)v.tag == 6) {
LAB_001317e3:
      if ((0xfffffff4 < local_58._8_4_) &&
         (iVar3 = *local_58.ptr, *(int *)local_58.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,_local_58);
      }
      if ((0xfffffff4 < (uint)v.tag) &&
         (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      v = (JSValue)(ZEXT816(6) << 0x40);
      uVar5 = 0;
    }
    else {
      if (((int)local_50 == -1) && (*(short *)((long)local_58.ptr + 6) == 0xf)) {
        lVar7 = *(long *)((long)local_58.ptr + 0x30);
      }
      else {
        lVar7 = 0;
      }
      lVar6 = 0;
      do {
        obj.tag = *(int64_t *)(lVar7 + 0x18 + lVar6);
        obj.u.ptr = ((JSValueUnion *)(lVar7 + 0x10 + lVar6))->ptr;
        iVar3 = check_function(ctx,obj);
        if (iVar3 != 0) goto LAB_001317e3;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar6 = 0;
      do {
        piVar1 = *(int **)(lVar7 + 0x10 + lVar6);
        uVar2 = *(undefined8 *)(lVar7 + 0x18 + lVar6);
        if (0xfffffff4 < (uint)uVar2) {
          *piVar1 = *piVar1 + 1;
        }
        *(int **)((long)&resolving_funcs->u + lVar6) = piVar1;
        *(undefined8 *)((long)&resolving_funcs->tag + lVar6) = uVar2;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      if ((0xfffffff4 < local_58._8_4_) &&
         (iVar3 = *local_58.ptr, *(int *)local_58.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,_local_58);
      }
      uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
    }
  }
  JVar8.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar5);
  JVar8.tag = v.tag;
  return JVar8;
}

Assistant:

static JSValue js_new_promise_capability(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst ctor)
{
    JSValue executor, result_promise;
    JSCFunctionDataRecord *s;
    int i;

    executor = js_promise_executor_new(ctx);
    if (JS_IsException(executor))
        return executor;

    if (JS_IsUndefined(ctor)) {
        result_promise = js_promise_constructor(ctx, ctor, 1,
                                                (JSValueConst *)&executor);
    } else {
        result_promise = JS_CallConstructor(ctx, ctor, 1,
                                            (JSValueConst *)&executor);
    }
    if (JS_IsException(result_promise))
        goto fail;
    s = JS_GetOpaque(executor, JS_CLASS_C_FUNCTION_DATA);
    for(i = 0; i < 2; i++) {
        if (check_function(ctx, s->data[i]))
            goto fail;
    }
    for(i = 0; i < 2; i++)
        resolving_funcs[i] = JS_DupValue(ctx, s->data[i]);
    JS_FreeValue(ctx, executor);
    return result_promise;
 fail:
    JS_FreeValue(ctx, executor);
    JS_FreeValue(ctx, result_promise);
    return JS_EXCEPTION;
}